

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::calendar::~calendar(calendar *this)

{
  abstract_calendar *paVar1;
  
  paVar1 = (this->impl_).ptr_;
  if (paVar1 != (abstract_calendar *)0x0) {
    (*paVar1->_vptr_abstract_calendar[0xe])();
  }
  std::__cxx11::string::~string((string *)&this->tz_);
  std::locale::~locale(&this->locale_);
  return;
}

Assistant:

calendar::~calendar()
{
}